

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O3

void Assimp::ExportSceneXFile
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 uVar5;
  runtime_error *prVar6;
  string file;
  string path;
  ExportProperties props;
  XFileExporter iDoTheExportThing;
  allocator<char> local_3a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360;
  string local_340;
  ExportProperties local_320;
  undefined1 local_260 [40];
  byte abStack_238 [520];
  long *plVar4;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_260,pFile,(allocator<char> *)&local_320);
  DefaultIOSystem::absolutePath(&local_340,(string *)local_260);
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_260,pFile,(allocator<char> *)&local_320);
  DefaultIOSystem::completeBaseName(&local_360,(string *)local_260);
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
  }
  ExportProperties::ExportProperties(&local_320,pProperties);
  bVar2 = ExportProperties::HasPropertyBool(&local_320,"EXPORT_XFILE_64BIT");
  if (!bVar2) {
    ExportProperties::SetPropertyInteger(&local_320,"EXPORT_XFILE_64BIT",0);
  }
  XFileExporter::XFileExporter
            ((XFileExporter *)local_260,pScene,pIOSystem,&local_340,&local_360,&local_320);
  if ((abStack_238[*(long *)(local_260._8_8_ - 0x18)] & 5) == 0) {
    iVar3 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    if (plVar4 != (long *)0x0) {
      std::__cxx11::stringbuf::str();
      _Var1._M_p = local_3a0._M_dataplus._M_p;
      uVar5 = std::ostream::tellp();
      (**(code **)(*plVar4 + 0x18))(plVar4,_Var1._M_p,uVar5,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      (**(code **)(*plVar4 + 8))(plVar4);
      XFileExporter::~XFileExporter((XFileExporter *)local_260);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
      ::~_Rb_tree(&local_320.mMatrixProperties._M_t);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_320.mStringProperties._M_t);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
      ::~_Rb_tree(&local_320.mFloatProperties._M_t);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   *)&local_320);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,pFile,&local_3a1);
    std::operator+(&local_3a0,"could not open output .x file: ",&local_380);
    std::runtime_error::runtime_error(prVar6,(string *)&local_3a0);
    *(undefined ***)prVar6 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,pFile,&local_3a1);
  std::operator+(&local_3a0,"output data creation failed. Most likely the file became too large: ",
                 &local_380);
  std::runtime_error::runtime_error(prVar6,(string *)&local_3a0);
  *(undefined ***)prVar6 = &PTR__runtime_error_0080bf48;
  __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportSceneXFile(const char* pFile,IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* pProperties)
{
    std::string path = DefaultIOSystem::absolutePath(std::string(pFile));
    std::string file = DefaultIOSystem::completeBaseName(std::string(pFile));

    // create/copy Properties
    ExportProperties props(*pProperties);

    // set standard properties if not set
    if (!props.HasPropertyBool(AI_CONFIG_EXPORT_XFILE_64BIT)) props.SetPropertyBool(AI_CONFIG_EXPORT_XFILE_64BIT, false);

    // invoke the exporter
    XFileExporter iDoTheExportThing( pScene, pIOSystem, path, file, &props);

    if (iDoTheExportThing.mOutput.fail()) {
        throw DeadlyExportError("output data creation failed. Most likely the file became too large: " + std::string(pFile));
    }
    
    // we're still here - export successfully completed. Write result to the given IOSYstem
    std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
    if(outfile == NULL) {
        throw DeadlyExportError("could not open output .x file: " + std::string(pFile));
    }

    // XXX maybe use a small wrapper around IOStream that behaves like std::stringstream in order to avoid the extra copy.
    outfile->Write( iDoTheExportThing.mOutput.str().c_str(), static_cast<size_t>(iDoTheExportThing.mOutput.tellp()),1);
}